

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::set_default_logger
          (registry *this,shared_ptr<spdlog::logger> *new_default_logger)

{
  bool bVar1;
  element_type *peVar2;
  lock_guard<std::mutex> lock;
  key_type *in_stack_ffffffffffffff98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *in_stack_ffffffffffffffa0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,
             (mutex_type *)in_stack_ffffffffffffff98);
  bVar1 = std::operator!=((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x22d90f);
    logger::name_abi_cxx11_(peVar2);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
    ::erase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  bVar1 = std::operator!=((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x22d97a);
    logger::name_abi_cxx11_(peVar2);
    in_stack_ffffffffffffffa0 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
            ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::shared_ptr<spdlog::logger>::operator=
              ((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa0,
               (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffff98);
  }
  std::shared_ptr<spdlog::logger>::operator=
            ((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa0,
             (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffff98);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22d9ce);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_default_logger(std::shared_ptr<logger> new_default_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    // remove previous default logger from the map
    if (default_logger_ != nullptr)
    {
        loggers_.erase(default_logger_->name());
    }
    if (new_default_logger != nullptr)
    {
        loggers_[new_default_logger->name()] = new_default_logger;
    }
    default_logger_ = std::move(new_default_logger);
}